

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O0

void duckdb::NumericStats::TemplatedVerify<duckdb::uhugeint_t>
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  bool bVar1;
  undefined8 uVar2;
  ulong in_RCX;
  SelectionVector *in_RDX;
  uhugeint_t uVar3;
  idx_t in_stack_00000120;
  Vector *in_stack_00000128;
  idx_t index;
  idx_t idx;
  idx_t i;
  Value max_value;
  Value min_value;
  uhugeint_t *data;
  UnifiedVectorFormat vdata;
  uhugeint_t *in_stack_fffffffffffffd68;
  UnifiedVectorFormat *in_stack_fffffffffffffd70;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  UnifiedVectorFormat *in_stack_fffffffffffffd80;
  bool local_261;
  BaseStatistics *in_stack_fffffffffffffda8;
  bool local_22a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  InternalException *in_stack_fffffffffffffe10;
  UnifiedVectorFormat *in_stack_fffffffffffffe30;
  idx_t in_stack_fffffffffffffe38;
  Vector *in_stack_fffffffffffffe40;
  allocator local_149;
  string local_148 [32];
  uhugeint_t local_128;
  idx_t local_118;
  idx_t local_110;
  ulong local_108;
  Value local_100;
  Value local_c0;
  uhugeint_t *local_80;
  SelectionVector *local_68;
  BaseStatistics *in_stack_ffffffffffffffc8;
  
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffd80);
  Vector::ToUnifiedFormat
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  local_80 = UnifiedVectorFormat::GetData<duckdb::uhugeint_t>((UnifiedVectorFormat *)&local_68);
  MinOrNull(in_stack_fffffffffffffda8);
  MaxOrNull(in_stack_fffffffffffffda8);
  local_108 = 0;
  do {
    if (in_RCX <= local_108) {
      Value::~Value((Value *)in_stack_fffffffffffffd70);
      Value::~Value((Value *)in_stack_fffffffffffffd70);
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffd70);
      return;
    }
    local_110 = SelectionVector::get_index(in_RDX,local_108);
    local_118 = SelectionVector::get_index(local_68,local_110);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)
                       CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                       (idx_t)in_stack_fffffffffffffd70);
    if (bVar1) {
      bVar1 = Value::IsNull(&local_c0);
      local_22a = false;
      if (!bVar1) {
        uVar3 = Value::GetValueUnsafe<duckdb::uhugeint_t>(&local_c0);
        local_128 = uVar3;
        local_22a = LessThan::Operation<duckdb::uhugeint_t>
                              ((uhugeint_t *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      }
      if (local_22a != false) {
        uVar2 = __cxa_allocate_exception(0x10);
        paVar4 = &local_149;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_148,
                   "Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
                   paVar4);
        BaseStatistics::ToString_abi_cxx11_(in_stack_ffffffffffffffc8);
        Vector::ToString_abi_cxx11_(in_stack_00000128,in_stack_00000120);
        InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdf8);
        __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
      }
      bVar1 = Value::IsNull(&local_100);
      local_261 = false;
      if (!bVar1) {
        Value::GetValueUnsafe<duckdb::uhugeint_t>(&local_100);
        in_stack_fffffffffffffd7f =
             GreaterThan::Operation<duckdb::uhugeint_t>
                       ((uhugeint_t *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        local_261 = (bool)in_stack_fffffffffffffd7f;
      }
      if (local_261 != false) {
        uVar2 = __cxa_allocate_exception(0x10);
        paVar4 = (allocator *)&stack0xfffffffffffffe37;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffe38,
                   "Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
                   paVar4);
        BaseStatistics::ToString_abi_cxx11_(in_stack_ffffffffffffffc8);
        Vector::ToString_abi_cxx11_(in_stack_00000128,in_stack_00000120);
        InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdf8);
        __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
      }
    }
    local_108 = local_108 + 1;
  } while( true );
}

Assistant:

void NumericStats::TemplatedVerify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel,
                                   idx_t count) {
	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	auto min_value = NumericStats::MinOrNull(stats);
	auto max_value = NumericStats::MaxOrNull(stats);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		if (!vdata.validity.RowIsValid(index)) {
			continue;
		}
		if (!min_value.IsNull() && LessThan::Operation(data[index], min_value.GetValueUnsafe<T>())) { // LCOV_EXCL_START
			throw InternalException("Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		} // LCOV_EXCL_STOP
		if (!max_value.IsNull() && GreaterThan::Operation(data[index], max_value.GetValueUnsafe<T>())) {
			throw InternalException("Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		}
	}
}